

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,REF_INT faceid)

{
  REF_INT RVar1;
  REF_GRID pRVar2;
  REF_CELL ref_cell_00;
  uint uVar3;
  REF_INT local_e0;
  REF_INT local_dc;
  int local_d8;
  REF_INT local_d4;
  REF_INT local_d0;
  int local_cc;
  REF_INT local_c8;
  REF_INT local_c4;
  int local_c0;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL reversed;
  REF_INT tri;
  REF_INT cell_node;
  REF_INT cell_item;
  REF_INT tet;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT seg;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [4];
  int local_3c;
  REF_INT item;
  REF_CELL ref_cell;
  REF_INT node;
  REF_GRID ref_grid;
  REF_INT faceid_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar2 = ref_cavity->ref_grid;
  ref_cell_00 = pRVar2->cell[8];
  local_3c = 0;
  while( true ) {
    if (ref_cavity->tri_list->n <= local_3c) {
      tet1 = 0;
      do {
        if (ref_cavity->maxseg <= tet1) {
          if (ref_cavity->debug != 0) {
            ref_cavity_tec(ref_cavity,"form-tet.tec");
          }
          if (ref_cavity->debug != 0) {
            printf("insert face form state %d\n",(ulong)ref_cavity->state);
          }
          ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold(ref_cavity);
          if (ref_cavity_local._4_4_ == 0) {
            if (ref_cavity->debug != 0) {
              printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
            }
            ref_cavity_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x430,"ref_cavity_form_insert2_tet",(ulong)ref_cavity_local._4_4_,
                   "ball face manifold");
          }
          return ref_cavity_local._4_4_;
        }
        if (((-1 < tet1) && (tet1 < ref_cavity->maxseg)) && (ref_cavity->s2n[tet1 * 3] != -1)) {
          seg_nodes[1] = ref_cavity->s2n[tet1 * 3];
          seg_nodes[2] = ref_cavity->s2n[tet1 * 3 + 1];
          uVar3 = ref_cavity_insert_face(ref_cavity,seg_nodes + 1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x429,"ref_cavity_form_insert2_tet",(ulong)uVar3,"tet side");
            return uVar3;
          }
        }
        tet1 = tet1 + 1;
      } while( true );
    }
    ref_private_macro_code_rss = ref_cavity->tri_list->value[local_3c];
    seg_nodes[1] = pRVar2->cell[3]->c2n[pRVar2->cell[3]->size_per * ref_private_macro_code_rss];
    seg_nodes[2] = pRVar2->cell[3]->c2n[pRVar2->cell[3]->size_per * ref_private_macro_code_rss + 1];
    RVar1 = pRVar2->cell[3]->c2n[pRVar2->cell[3]->size_per * ref_private_macro_code_rss + 2];
    ref_private_status_reis_ai._0_4_ = ref_cell_with_face(ref_cell_00,seg_nodes + 1,&tet,&cell_item)
    ;
    if ((uint)ref_private_status_reis_ai != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fa,"ref_cavity_form_insert2_tet",(ulong)(uint)ref_private_status_reis_ai,"tet");
      return (uint)ref_private_status_reis_ai;
    }
    if (tet == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fb,"ref_cavity_form_insert2_tet","tet0 not found");
      return 1;
    }
    if ((long)cell_item != -1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fc,"ref_cavity_form_insert2_tet","tet1 found",0xffffffffffffffff,(long)cell_item);
      return 1;
    }
    uVar3 = ref_cavity_add_tet_without_faceid(ref_cavity,tet,faceid);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x3fe,"ref_cavity_form_insert2_tet",(ulong)uVar3,"add interior tet face");
      return uVar3;
    }
    tet0 = seg_nodes[1];
    seg = seg_nodes[2];
    uVar3 = ref_cavity_find_seg(ref_cavity,&tet0,&tet1,
                                (REF_BOOL *)((long)&ref_private_status_reis_ai + 4));
    if ((uVar3 != 0) && (uVar3 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x403,"ref_cavity_form_insert2_tet",(ulong)uVar3,"find existing");
      return uVar3;
    }
    if (tet1 == -1) {
      if ((tet0 < 0) || (ref_cell_00->ref_adj->nnode <= tet0)) {
        local_c0 = -1;
      }
      else {
        local_c0 = ref_cell_00->ref_adj->first[tet0];
      }
      tri = local_c0;
      if (local_c0 == -1) {
        local_c4 = -1;
      }
      else {
        local_c4 = ref_cell_00->ref_adj->item[local_c0].ref;
      }
      cell_node = local_c4;
      while (tri != -1) {
        for (reversed = 0; reversed < ref_cell_00->node_per; reversed = reversed + 1) {
          if ((seg == ref_cell_00->c2n[reversed + ref_cell_00->size_per * cell_node]) &&
             (uVar3 = ref_cavity_add_tet_without_faceid(ref_cavity,cell_node,faceid), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x408,"ref_cavity_form_insert2_tet",(ulong)uVar3,"add interior tet face");
            return uVar3;
          }
        }
        tri = ref_cell_00->ref_adj->item[tri].next;
        if (tri == -1) {
          local_c8 = -1;
        }
        else {
          local_c8 = ref_cell_00->ref_adj->item[tri].ref;
        }
        cell_node = local_c8;
      }
    }
    tet0 = seg_nodes[2];
    seg = RVar1;
    uVar3 = ref_cavity_find_seg(ref_cavity,&tet0,&tet1,
                                (REF_BOOL *)((long)&ref_private_status_reis_ai + 4));
    if ((uVar3 != 0) && (uVar3 != 5)) break;
    if (tet1 == -1) {
      if ((tet0 < 0) || (ref_cell_00->ref_adj->nnode <= tet0)) {
        local_cc = -1;
      }
      else {
        local_cc = ref_cell_00->ref_adj->first[tet0];
      }
      tri = local_cc;
      if (local_cc == -1) {
        local_d0 = -1;
      }
      else {
        local_d0 = ref_cell_00->ref_adj->item[local_cc].ref;
      }
      cell_node = local_d0;
      while (tri != -1) {
        for (reversed = 0; reversed < ref_cell_00->node_per; reversed = reversed + 1) {
          if ((seg == ref_cell_00->c2n[reversed + ref_cell_00->size_per * cell_node]) &&
             (uVar3 = ref_cavity_add_tet_without_faceid(ref_cavity,cell_node,faceid), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x414,"ref_cavity_form_insert2_tet",(ulong)uVar3,"add interior tet face");
            return uVar3;
          }
        }
        tri = ref_cell_00->ref_adj->item[tri].next;
        if (tri == -1) {
          local_d4 = -1;
        }
        else {
          local_d4 = ref_cell_00->ref_adj->item[tri].ref;
        }
        cell_node = local_d4;
      }
    }
    seg = seg_nodes[1];
    tet0 = RVar1;
    uVar3 = ref_cavity_find_seg(ref_cavity,&tet0,&tet1,
                                (REF_BOOL *)((long)&ref_private_status_reis_ai + 4));
    if ((uVar3 != 0) && (uVar3 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x41b,"ref_cavity_form_insert2_tet",(ulong)uVar3,"find existing");
      return uVar3;
    }
    if (tet1 == -1) {
      if ((tet0 < 0) || (ref_cell_00->ref_adj->nnode <= tet0)) {
        local_d8 = -1;
      }
      else {
        local_d8 = ref_cell_00->ref_adj->first[tet0];
      }
      tri = local_d8;
      if (local_d8 == -1) {
        local_dc = -1;
      }
      else {
        local_dc = ref_cell_00->ref_adj->item[local_d8].ref;
      }
      cell_node = local_dc;
      while (tri != -1) {
        for (reversed = 0; reversed < ref_cell_00->node_per; reversed = reversed + 1) {
          if ((seg == ref_cell_00->c2n[reversed + ref_cell_00->size_per * cell_node]) &&
             (uVar3 = ref_cavity_add_tet_without_faceid(ref_cavity,cell_node,faceid), uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x420,"ref_cavity_form_insert2_tet",(ulong)uVar3,"add interior tet face");
            return uVar3;
          }
        }
        tri = ref_cell_00->ref_adj->item[tri].next;
        if (tri == -1) {
          local_e0 = -1;
        }
        else {
          local_e0 = ref_cell_00->ref_adj->item[tri].ref;
        }
        cell_node = local_e0;
      }
    }
    local_3c = local_3c + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x40f,
         "ref_cavity_form_insert2_tet",(ulong)uVar3,"find existing");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2_tet(REF_CAVITY ref_cavity,
                                               REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_CELL ref_cell;
  REF_INT item;
  REF_INT face_nodes[4], seg_nodes[3], seg;
  /* add tets off wall from seg */
  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    REF_INT tet0, tet1, tet, cell_item, cell_node;
    REF_INT tri;
    REF_BOOL reversed;
    tri = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    face_nodes[0] = ref_cell_c2n(ref_grid_tri(ref_grid), 0, tri);
    face_nodes[1] = ref_cell_c2n(ref_grid_tri(ref_grid), 1, tri);
    face_nodes[2] = ref_cell_c2n(ref_grid_tri(ref_grid), 2, tri);
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(ref_cell, face_nodes, &tet0, &tet1), "tet");
    RUS(REF_EMPTY, tet0, "tet0 not found");
    REIS(REF_EMPTY, tet1, "tet1 found");
    RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet0, faceid),
        "add interior tet face");

    seg_nodes[0] = face_nodes[0];
    seg_nodes[1] = face_nodes[1];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[1];
    seg_nodes[1] = face_nodes[2];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }

    seg_nodes[0] = face_nodes[2];
    seg_nodes[1] = face_nodes[0];
    RXS(ref_cavity_find_seg(ref_cavity, seg_nodes, &seg, &reversed),
        REF_NOT_FOUND, "find existing");
    if (REF_EMPTY == seg) {
      each_ref_cell_having_node2(ref_cell, seg_nodes[0], seg_nodes[1],
                                 cell_item, cell_node, tet) {
        RSS(ref_cavity_add_tet_without_faceid(ref_cavity, tet, faceid),
            "add interior tet face");
      }
    }
  }

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    face_nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    face_nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    face_nodes[2] = node;
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tet.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert face form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}